

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_polynomial_model.hpp
# Opt level: O2

BinaryPolynomialModel<unsigned_int,_double> * __thiscall
cimod::BinaryPolynomialModel<unsigned_int,_double>::ChangeVartype
          (BinaryPolynomialModel<unsigned_int,_double> *__return_storage_ptr__,
          BinaryPolynomialModel<unsigned_int,_double> *this,Vartype vartype,bool inplace)

{
  runtime_error *this_00;
  BinaryPolynomialModel<unsigned_int,_double> local_150;
  
  if (vartype == BINARY) {
    if (!inplace) {
      ToBinary(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    }
    ToBinary(&local_150,this);
  }
  else {
    if (vartype != SPIN) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Unknown vartype error");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (!inplace) {
      ToSpin(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    }
    ToSpin(&local_150,this);
  }
  operator=(this,&local_150);
  ~BinaryPolynomialModel(&local_150);
  BinaryPolynomialModel(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

BinaryPolynomialModel ChangeVartype( const Vartype vartype, const bool inplace ) {

      if ( vartype == Vartype::SPIN ) {
        if ( inplace ) {
          *this = ToSpin();
          return *this;
        } else {
          return ToSpin();
        }
      } else if ( vartype == Vartype::BINARY ) {
        if ( inplace ) {
          *this = ToBinary();
          return *this;
        } else {
          return ToBinary();
        }
      } else {
        throw std::runtime_error( "Unknown vartype error" );
      }
    }